

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idlist.h
# Opt level: O0

void __thiscall
soplex::IdList<soplex::SVSetBase<double>::DLPSV>::move
          (IdList<soplex::SVSetBase<double>::DLPSV> *this,ptrdiff_t delta)

{
  DLPSV *elem_00;
  DLPSV *pDVar1;
  DLPSV **ppDVar2;
  DLPSV **ppDVar3;
  IsList<soplex::SVSetBase<double>::DLPSV> *in_RSI;
  IdList<soplex::SVSetBase<double>::DLPSV> *in_RDI;
  DLPSV *elem;
  ptrdiff_t in_stack_ffffffffffffffe8;
  DLPSV *this_00;
  
  if ((in_RDI->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_first != (DLPSV *)0x0) {
    IsList<soplex::SVSetBase<double>::DLPSV>::move(in_RSI,in_stack_ffffffffffffffe8);
    for (elem_00 = last(in_RDI); elem_00 != (DLPSV *)0x0; elem_00 = prev(in_RDI,elem_00)) {
      this_00 = elem_00;
      pDVar1 = first(in_RDI);
      if (elem_00 != pDVar1) {
        ppDVar2 = SVSetBase<double>::DLPSV::prev(this_00);
        pDVar1 = *ppDVar2;
        ppDVar2 = &in_RSI->the_first;
        ppDVar3 = SVSetBase<double>::DLPSV::prev(this_00);
        *ppDVar3 = (DLPSV *)((long)ppDVar2 + (long)&pDVar1->super_SVectorBase<double>);
      }
    }
  }
  return;
}

Assistant:

void move(ptrdiff_t delta)
   {
      if(this->the_first)
      {
         T* elem;
         IsList<T>::move(delta);

         for(elem = last(); elem; elem = prev(elem))
            if(elem != first())
               elem->prev() = reinterpret_cast<T*>(
                                 reinterpret_cast<char*>(elem->prev()) + delta);
      }
   }